

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CECorrections.cpp
# Opt level: O0

void __thiscall CECorrections::UpdateNutationCache(CECorrections *this,double *mjd)

{
  difference_type dVar1;
  size_type sVar2;
  undefined8 uVar3;
  reference pvVar4;
  reference pvVar5;
  reference pvVar6;
  double *in_RSI;
  CECorrections *in_RDI;
  double dVar7;
  double mjd_upper;
  double mjd_lower;
  string msg;
  string max_mjd;
  string min_mjd;
  int indx;
  CECorrections *in_stack_000002a0;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffde8;
  double *pdVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdf0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdf8;
  double *in_stack_fffffffffffffe08;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> in_stack_fffffffffffffe10;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> in_stack_fffffffffffffe18;
  undefined8 in_stack_fffffffffffffe38;
  int __val;
  string *message;
  string *origin;
  invalid_value *in_stack_fffffffffffffe50;
  double local_1a0;
  double local_198;
  undefined1 local_18a;
  undefined1 local_189 [33];
  string local_168 [32];
  string local_148 [32];
  string local_128 [32];
  string local_108 [32];
  string local_e8 [32];
  string local_c8 [144];
  int *local_38;
  int *local_30;
  int *local_28;
  int *local_20;
  int local_14;
  double *local_10;
  
  __val = (int)((ulong)in_stack_fffffffffffffe38 >> 0x20);
  if ((*in_RSI == in_RDI->cache_nut_mjd_) && (!NAN(*in_RSI) && !NAN(in_RDI->cache_nut_mjd_))) {
    return;
  }
  local_10 = in_RSI;
  LoadNutation(in_stack_000002a0);
  local_28 = (int *)std::vector<int,_std::allocator<int>_>::begin(in_stack_fffffffffffffde8);
  local_30 = (int *)std::vector<int,_std::allocator<int>_>::end(in_stack_fffffffffffffde8);
  local_20 = (int *)std::
                    lower_bound<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,double>
                              (in_stack_fffffffffffffe18,in_stack_fffffffffffffe10,
                               in_stack_fffffffffffffe08);
  local_38 = (int *)std::vector<int,_std::allocator<int>_>::begin(in_stack_fffffffffffffde8);
  dVar1 = __gnu_cxx::operator-
                    ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                     in_stack_fffffffffffffdf0,
                     (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                     in_stack_fffffffffffffde8);
  local_14 = (int)dVar1 + -1;
  if (-1 < local_14) {
    in_stack_fffffffffffffe50 = (invalid_value *)(long)local_14;
    sVar2 = std::vector<int,_std::allocator<int>_>::size(&in_RDI->nutation_mjd_);
    if (in_stack_fffffffffffffe50 < (invalid_value *)(sVar2 - 1)) {
      if ((in_RDI->interp_ & 1U) == 0) {
        pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                           (&in_RDI->nutation_dut1_,(long)local_14);
        in_RDI->cache_nut_dut1_ = *pvVar4;
        pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                           (&in_RDI->nutation_xp_,(long)local_14);
        in_RDI->cache_nut_xp_ = *pvVar4;
        pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                           (&in_RDI->nutation_yp_,(long)local_14);
        in_RDI->cache_nut_yp_ = *pvVar4;
        pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                           (&in_RDI->nutation_deps_,(long)local_14);
        in_RDI->cache_nut_deps_ = *pvVar4;
        pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                           (&in_RDI->nutation_dpsi_,(long)local_14);
        in_RDI->cache_nut_dpsi_ = *pvVar4;
      }
      else {
        pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                           (&in_RDI->nutation_mjd_,(long)local_14);
        local_198 = (double)*pvVar5;
        pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                           (&in_RDI->nutation_mjd_,(long)(local_14 + 1));
        local_1a0 = (double)*pvVar5;
        pdVar8 = local_10;
        pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                           (&in_RDI->nutation_dut1_,(long)local_14);
        pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                           (&in_RDI->nutation_dut1_,(long)(local_14 + 1));
        dVar7 = InterpValue(in_RDI,pdVar8,&local_198,&local_1a0,pvVar4,pvVar6);
        in_RDI->cache_nut_dut1_ = dVar7;
        pdVar8 = local_10;
        pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                           (&in_RDI->nutation_xp_,(long)local_14);
        pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                           (&in_RDI->nutation_xp_,(long)(local_14 + 1));
        dVar7 = InterpValue(in_RDI,pdVar8,&local_198,&local_1a0,pvVar4,pvVar6);
        in_RDI->cache_nut_xp_ = dVar7;
        pdVar8 = local_10;
        pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                           (&in_RDI->nutation_yp_,(long)local_14);
        pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                           (&in_RDI->nutation_yp_,(long)(local_14 + 1));
        dVar7 = InterpValue(in_RDI,pdVar8,&local_198,&local_1a0,pvVar4,pvVar6);
        in_RDI->cache_nut_yp_ = dVar7;
        pdVar8 = local_10;
        pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                           (&in_RDI->nutation_deps_,(long)local_14);
        pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                           (&in_RDI->nutation_deps_,(long)(local_14 + 1));
        dVar7 = InterpValue(in_RDI,pdVar8,&local_198,&local_1a0,pvVar4,pvVar6);
        pdVar8 = local_10;
        in_RDI->cache_nut_deps_ = dVar7;
        pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                           (&in_RDI->nutation_dpsi_,(long)local_14);
        pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                           (&in_RDI->nutation_dpsi_,(long)(local_14 + 1));
        dVar7 = InterpValue(in_RDI,pdVar8,&local_198,&local_1a0,pvVar4,pvVar6);
        in_RDI->cache_nut_dpsi_ = dVar7;
      }
      in_RDI->cache_nut_mjd_ = *local_10;
      return;
    }
  }
  origin = (string *)&in_RDI->nutation_mjd_;
  std::vector<int,_std::allocator<int>_>::front
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffdf0);
  std::__cxx11::to_string(__val);
  std::vector<int,_std::allocator<int>_>::back
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffdf0);
  std::__cxx11::to_string(__val);
  std::__cxx11::to_string((double)in_stack_fffffffffffffdf8);
  std::operator+((char *)in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf0);
  std::operator+(in_stack_fffffffffffffdf8,(char *)in_stack_fffffffffffffdf0);
  std::operator+(in_stack_fffffffffffffdf8,(char *)in_stack_fffffffffffffdf0);
  std::operator+(in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf0);
  std::operator+(in_stack_fffffffffffffdf8,(char *)in_stack_fffffffffffffdf0);
  std::operator+(in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf0);
  std::__cxx11::string::~string(local_c8);
  std::__cxx11::string::~string(local_e8);
  std::__cxx11::string::~string(local_108);
  std::__cxx11::string::~string(local_128);
  std::__cxx11::string::~string(local_148);
  std::__cxx11::string::~string(local_168);
  local_18a = 1;
  uVar3 = __cxa_allocate_exception(0xa8);
  message = (string *)local_189;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(local_189 + 1),"UpdateNutationCache",(allocator *)message)
  ;
  CEException::invalid_value::invalid_value(in_stack_fffffffffffffe50,origin,message);
  local_18a = 0;
  __cxa_throw(uVar3,&CEException::invalid_value::typeinfo,CEException::invalid_value::~invalid_value
             );
}

Assistant:

void CECorrections::UpdateNutationCache(const double& mjd) const
{
    // Check if the nutation actually needs to be updated
    if (mjd != cache_nut_mjd_) {
        // Make sure nutation corrections are loaded
        LoadNutation();

        // Compute the closest index associated with the MJD
        int indx = (std::lower_bound(nutation_mjd_.begin(),nutation_mjd_.end(), mjd) 
                    - nutation_mjd_.begin() ) - 1;

        // Make sure the MJD date is covered by stored correction values
        if ((indx < 0) || (indx >= nutation_mjd_.size()-1)) {
            // TODO: Make this a warning message
            std::string min_mjd(std::to_string(nutation_mjd_.front()));
            std::string max_mjd(std::to_string(nutation_mjd_.back()));
            std::string msg = "Invalid mjd: " + std::to_string(mjd) + ". Accepted " +
                            "range is " + min_mjd + " - " + max_mjd;
            throw CEException::invalid_value(__func__, msg);
        } 

        // Get the uninterpolated value
        else if (!interp_) {
            cache_nut_dut1_ = nutation_dut1_[indx];
            cache_nut_xp_   = nutation_xp_[indx];
            cache_nut_yp_   = nutation_yp_[indx];
            cache_nut_deps_ = nutation_deps_[indx];
            cache_nut_dpsi_ = nutation_dpsi_[indx];
        } 
        
        // Otherwise interpolate between closest two values (a bit slower)
        else {
            double mjd_lower( nutation_mjd_[indx] );
            double mjd_upper( nutation_mjd_[indx+1] );
            
            cache_nut_dut1_ = InterpValue(mjd, mjd_lower, mjd_upper,
                                          nutation_dut1_[indx], 
                                          nutation_dut1_[indx+1]);
            cache_nut_xp_   = InterpValue(mjd, mjd_lower, mjd_upper,
                                          nutation_xp_[indx], 
                                          nutation_xp_[indx+1]);
            cache_nut_yp_   = InterpValue(mjd, mjd_lower, mjd_upper,
                                          nutation_yp_[indx], 
                                          nutation_yp_[indx+1]);
            cache_nut_deps_ = InterpValue(mjd, mjd_lower, mjd_upper,
                                          nutation_deps_[indx], 
                                          nutation_deps_[indx+1]);
            cache_nut_dpsi_ = InterpValue(mjd, mjd_lower, mjd_upper,
                                          nutation_dpsi_[indx], 
                                          nutation_dpsi_[indx+1]);
        }

        cache_nut_mjd_  = mjd;
    }

    return;
}